

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O0

exr_result_t
internal_decode_free_buffer
          (exr_decode_pipeline_t *decode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *sz)

{
  void *pvVar1;
  _internal_exr_context *c;
  exr_result_t eVar2;
  long *in_RCX;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  size_t cursz;
  void *curbuf;
  
  pvVar1 = (void *)*in_RDX;
  if (pvVar1 != (void *)0x0) {
    if (*in_RCX != 0) {
      if (*(long *)(in_RDI + 200) == 0) {
        c = *(_internal_exr_context **)(in_RDI + 0x10);
        if (c == (_internal_exr_context *)0x0) {
          return 2;
        }
        if ((*(int *)(in_RDI + 0xc) < 0) || (c->num_parts <= *(int *)(in_RDI + 0xc))) {
          if (c->mode == '\x01') {
            internal_exr_unlock(c);
          }
          eVar2 = (*c->print_error)(c,4,"Part index (%d) out of range",
                                    (ulong)*(uint *)(in_RDI + 0xc));
          return eVar2;
        }
        (*c->free_fn)(pvVar1);
      }
      else {
        (**(code **)(in_RDI + 200))(in_ESI,pvVar1);
      }
    }
    *in_RDX = 0;
  }
  *in_RCX = 0;
  return 0;
}

Assistant:

exr_result_t
internal_decode_free_buffer (
    exr_decode_pipeline_t*               decode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              sz)
{
    void*  curbuf = *buf;
    size_t cursz  = *sz;
    if (curbuf)
    {
        if (cursz > 0)
        {
            if (decode->free_fn)
                decode->free_fn (bufid, curbuf);
            else
            {
                EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                    decode->context, decode->part_index);

                pctxt->free_fn (curbuf);
            }
        }
        *buf = NULL;
    }
    *sz = 0;
    return EXR_ERR_SUCCESS;
}